

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

void comparing(double x)

{
  NewtonsMethod(x,(Func1D *)Functions::f,(Func1D *)Functions::df,1e-32,&it);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,0.001,1e-32,&it);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,1e-05,1e-32,&it);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,1e-07,1e-32,&it);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return;
}

Assistant:

void comparing(double x) {
    NewtonsMethod(x, Functions::f, Functions::df, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-3, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-5, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-7, 1e-32);
    std::cout << std::endl;
}